

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O2

QStringList * __thiscall
QInternalMimeData::formats(QStringList *__return_storage_ptr__,QInternalMimeData *this)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (**(code **)(*(long *)this + 0x80))();
  cVar1 = QtPrivate::QStringList_contains
                    ((QList_conflict1 *)__return_storage_ptr__,(QLatin1String *)0x16,0x5d28c4);
  if (cVar1 == '\0') {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    imageReadMimeFormats();
    puVar4 = (undefined1 *)0xffffffffffffffff;
    lVar3 = 0;
    do {
      puVar4 = puVar4 + 1;
      if ((ulong)local_48.size <= puVar4) goto LAB_002c3138;
      bVar2 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)__return_storage_ptr__,
                         (QString *)((long)&((local_48.ptr)->d).d + lVar3),CaseSensitive);
      lVar3 = lVar3 + 0x18;
    } while (!bVar2);
    latin1.m_data = "application/x-qt-image";
    latin1.m_size = 0x16;
    QString::QString((QString *)&local_60,latin1);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
LAB_002c3138:
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QInternalMimeData::formats() const
{
    QStringList realFormats = formats_sys();
    if (!realFormats.contains("application/x-qt-image"_L1)) {
        QStringList imageFormats = imageReadMimeFormats();
        for (int i = 0; i < imageFormats.size(); ++i) {
            if (realFormats.contains(imageFormats.at(i))) {
                realFormats += "application/x-qt-image"_L1;
                break;
            }
        }
    }
    return realFormats;
}